

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O1

void * If_ManSatBuildXYZ(int nLutSize)

{
  byte bVar1;
  sat_solver *s;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 in_register_0000003c;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  sat_solver *local_88;
  uint local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = CONCAT44(in_register_0000003c,nLutSize);
  bVar1 = (byte)nLutSize;
  iVar5 = nLutSize * 3 + -2;
  uVar10 = 1 << ((byte)iVar5 & 0x1f);
  uVar2 = 3 << (bVar1 & 0x1f);
  local_70 = (ulong)uVar2;
  local_7c = 1;
  local_50 = (ulong)(uint)(2 << (bVar1 & 0x1f));
  local_88 = sat_solver_new();
  sat_solver_setnvars(local_88,uVar10 + uVar2);
  if (iVar5 != 0x1f) {
    local_74 = (int)local_68 * 2;
    if (1 < (int)uVar10) {
      local_7c = uVar10;
    }
    uVar2 = (int)local_70 * 2;
    uVar6 = 0;
    local_78 = 1 << (bVar1 & 0x1f);
    do {
      uVar3 = (uint)uVar6;
      uVar10 = (int)(uVar3 >> ((byte)local_68 & 0x1f)) % local_78 + local_78;
      uVar4 = uVar3 >> ((byte)local_74 & 0x1f);
      iVar5 = (int)local_50;
      uVar8 = iVar5 + uVar4 * 4;
      uVar7 = iVar5 + uVar4 * 4 + 2;
      local_58 = (ulong)uVar7;
      uVar4 = iVar5 + uVar4 * 4 + 3;
      local_60 = (ulong)uVar4;
      if ((int)(uVar7 | uVar4 | (int)local_70 + uVar3 | uVar8 | uVar10) < 0) {
        __assert_fail("iVarC0 >= 0 && iVarC1 >= 0 && iVarD0 >= 0 && iVarD1 >= 0 && iVarD2 >= 0 && iVarD3 >= 0 && iVarZ >= 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1f5,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = uVar8 * 2 + 1;
      uVar3 = ((int)uVar3 % local_78) * 2;
      uVar10 = uVar10 * 2;
      local_94 = uVar3;
      local_90 = uVar10;
      local_8c = uVar2;
      local_40 = uVar6;
      iVar5 = sat_solver_addclause(local_88,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1fc,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = uVar8 * 2 + 3;
      uVar4 = uVar3 | 1;
      local_94 = uVar4;
      local_90 = uVar10;
      local_8c = uVar2;
      local_38 = (ulong)uVar8;
      iVar5 = sat_solver_addclause(local_88,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x203,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = (int)local_58 * 2 + 1;
      uVar7 = uVar10 | 1;
      local_94 = uVar3;
      local_90 = uVar7;
      local_8c = uVar2;
      iVar5 = sat_solver_addclause(local_88,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x20a,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = (int)local_60 * 2 + 1;
      local_94 = uVar4;
      local_90 = uVar7;
      local_8c = uVar2;
      iVar5 = sat_solver_addclause(local_88,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x211,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      iVar9 = (int)local_38;
      local_98 = iVar9 * 2;
      iVar11 = uVar2 + 1;
      local_94 = uVar3;
      local_90 = uVar10;
      local_8c = iVar11;
      local_48 = (ulong)uVar2;
      iVar5 = sat_solver_addclause(local_88,&local_98,(lit *)&local_88);
      s = local_88;
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x219,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = iVar9 * 2 + 2;
      local_94 = uVar4;
      local_90 = uVar10;
      local_8c = iVar11;
      iVar5 = sat_solver_addclause(local_88,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x220,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = (int)local_58 * 2;
      local_94 = uVar3;
      local_90 = uVar7;
      local_8c = iVar11;
      iVar5 = sat_solver_addclause(s,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x227,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      local_98 = (int)local_60 * 2;
      local_94 = uVar4;
      local_90 = uVar7;
      local_8c = iVar11;
      iVar5 = sat_solver_addclause(s,&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x22e,
                      "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
      }
      uVar10 = (int)local_40 + 1;
      uVar6 = (ulong)uVar10;
      uVar2 = (int)local_48 + 2;
    } while (local_7c != uVar10);
  }
  return local_88;
}

Assistant:

void * If_ManSatBuildXYZ( int nLutSize )
{
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (3 * nLutSize - 2));
    int nVars   = 3 * nMintsL + nMintsF;
    int iVarP0  = 0;           // LUT0 parameters (total nMintsL)
    int iVarP1  = nMintsL;     // LUT1 parameters (total nMintsL)
    int iVarP2  = 2 * nMintsL; // LUT2 parameters (total nMintsL)
    int m,iVarM = 3 * nMintsL; // MUX vars        (total nMintsF)
    sat_solver * p = sat_solver_new();
    sat_solver_setnvars( p, nVars );
    for ( m = 0; m < nMintsF; m++ )
        sat_solver_add_mux41( p, 
            iVarM  + m,
            iVarP0 + m % nMintsL, 
            iVarP1 + (m >> nLutSize) % nMintsL, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 0, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 1, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 2, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 3 );
    return p;
}